

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

IterationRequest __thiscall
helics::CallbackFederate::initializeOperationsCallback(CallbackFederate *this)

{
  iteration_time res;
  Modes MVar1;
  bool bVar2;
  function<helics::IterationRequest_()> *in_RDI;
  Federate *in_stack_00000010;
  Time in_stack_00000018;
  IterationRequest local_21;
  undefined8 in_stack_ffffffffffffffe8;
  IterationResult iterating;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  
  iterating = (IterationResult)((ulong)in_stack_ffffffffffffffe8 >> 0x38);
  MVar1 = std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)
                     ((long)&(in_RDI->super__Function_base)._M_functor +
                     *(long *)(*(long *)&(in_RDI->super__Function_base)._M_functor + -0x18) + 8),
                     seq_cst);
  if (MVar1 == STARTUP) {
    Federate::enteringInitializingMode
              ((Federate *)CONCAT71(in_stack_fffffffffffffff1,in_stack_fffffffffffffff0),iterating);
  }
  else {
    res._8_8_ = this;
    res.grantedTime.internalTimeCode = in_stack_00000018.internalTimeCode;
    Federate::enteringExecutingMode(in_stack_00000010,res);
  }
  bVar2 = std::function::operator_cast_to_bool((function<helics::IterationRequest_()> *)0x3be54b);
  if (bVar2) {
    local_21 = std::function<helics::IterationRequest_()>::operator()(in_RDI);
  }
  else {
    local_21 = NO_ITERATIONS;
  }
  return local_21;
}

Assistant:

IterationRequest CallbackFederate::initializeOperationsCallback()
{
    if (currentMode.load() == Modes::STARTUP) {
        enteringInitializingMode(IterationResult::NEXT_STEP);
    } else {
        enteringExecutingMode({timeZero, IterationResult::ITERATING});
    }

    return (initializationOperation) ? initializationOperation() : IterationRequest::NO_ITERATIONS;
}